

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamListStandardOut::restoreXml
          (ParamListStandardOut *this,Element *el,AddrSpaceManager *manage,
          vector<EffectRecord,_std::allocator<EffectRecord>_> *effectlist,bool normalstack)

{
  bool bVar1;
  reference this_00;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<ParamEntry> local_38;
  iterator iter;
  bool normalstack_local;
  vector<EffectRecord,_std::allocator<EffectRecord>_> *effectlist_local;
  AddrSpaceManager *manage_local;
  Element *el_local;
  ParamListStandardOut *this_local;
  
  iter._M_node._7_1_ = normalstack;
  ParamListStandard::restoreXml(&this->super_ParamListStandard,el,manage,effectlist,normalstack);
  std::_List_iterator<ParamEntry>::_List_iterator(&local_38);
  local_40 = (_List_node_base *)
             std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::begin
                       (&(this->super_ParamListStandard).entry);
  local_38._M_node = local_40;
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::end
                   (&(this->super_ParamListStandard).entry);
    bVar1 = std::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    this_00 = std::_List_iterator<ParamEntry>::operator*(&local_38);
    ParamEntry::extraChecks(this_00,&(this->super_ParamListStandard).entry);
    std::_List_iterator<ParamEntry>::operator++(&local_38);
  }
  return;
}

Assistant:

void ParamListStandardOut::restoreXml(const Element *el,const AddrSpaceManager *manage,vector<EffectRecord> &effectlist,bool normalstack)

{
  ParamListStandard::restoreXml(el,manage,effectlist,normalstack);
  // Check for double precision entries
  list<ParamEntry>::iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter)
    (*iter).extraChecks(entry);
}